

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cc
# Opt level: O3

void __thiscall Edge::initWithObs(Edge *this,Vector2d *obs)

{
  _Elt_pointer pMVar1;
  _Map_pointer ppMVar2;
  PointerType ptr;
  reference pMVar3;
  long lVar4;
  _Elt_pointer pMVar5;
  size_type __n;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pMVar1 = (this->
           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ).
           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pMVar5 = (this->
           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ).
           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  dVar9 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0];
  dVar10 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
           array[1];
  dVar7 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0] - dVar9;
  dVar8 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1] - dVar10;
  ppMVar2 = (this->
            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ).
            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar4 = (long)pMVar5 -
          (long)(this->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first;
  if (lVar4 == 0) {
    pMVar5 = ppMVar2[-1] + 0x15;
  }
  dVar9 = pMVar5[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] - dVar9;
  dVar10 = pMVar5[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] - dVar10;
  iVar6 = (int)((long)(this->
                      super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ).
                      super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar1 >> 3) *
          -0x55555555 + (int)(lVar4 >> 3) * -0x55555555 +
          ((int)((ulong)((long)ppMVar2 -
                        (long)(this->
                              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ).
                              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppMVar2 == (_Map_pointer)0x0)) * 0x15;
  dVar7 = SQRT(dVar8 * dVar8 + dVar7 * dVar7);
  dVar9 = SQRT(dVar10 * dVar10 + dVar9 * dVar9);
  if (dVar7 <= dVar9) {
    dVar9 = dVar7;
  }
  this->min_dist = dVar9;
  if (2 < iVar6) {
    __n = 1;
    do {
      std::
      deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::_M_range_check(&this->
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ,__n);
      pMVar3 = std::
               _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
               ::operator[](&(this->
                             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ).
                             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start,__n);
      dVar9 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] -
              (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[0];
      dVar10 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[1] -
               (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
               array[1];
      dVar10 = SQRT(dVar10 * dVar10 + dVar9 * dVar9);
      dVar9 = this->min_dist;
      if (dVar10 <= this->min_dist) {
        dVar9 = dVar10;
      }
      this->min_dist = dVar9;
      __n = __n + 1;
    } while (iVar6 - 1 != __n);
  }
  this->valid = true;
  return;
}

Assistant:

void Edge::initWithObs(Eigen::Vector2d obs) {
    LOG_CHECK("Init with obs, this address is: %x, size is %lu", this, this->size());
    Eigen::Vector2d front_beam = this->front().block<2, 1>(0, 0) - obs, back_beam = this->back().block<2, 1>(0, 0) - obs;
    int max_size = static_cast<int>(this->size()) - 1;
    min_dist = std::min(front_beam.norm(), back_beam.norm());
    for (int i = 1; i < max_size; i++) {
        Eigen::Vector2d vec = this->at(i).block<2, 1>(0, 0) - obs;
        min_dist = std::min(vec.norm(), min_dist);   
    }
    valid = true;
}